

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

void __thiscall
ot::commissioner::JobManager::ErrorMsg(JobManager *this,uint64_t aNid,string *aMessage)

{
  Interpreter *this_00;
  string sStack_38;
  
  this_00 = this->mInterpreter;
  std::__cxx11::string::string((string *)&sStack_38,(string *)aMessage);
  Interpreter::PrintNetworkMessage(this_00,aNid,&sStack_38,kRed);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void JobManager::ErrorMsg(uint64_t aNid, std::string aMessage)
{
    mInterpreter.PrintNetworkMessage(aNid, aMessage, Console::Color::kRed);
}